

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_psbt.cpp
# Opt level: O0

void __thiscall
cfdcapi_psbt_FundPsbt_Test::~cfdcapi_psbt_FundPsbt_Test(cfdcapi_psbt_FundPsbt_Test *this)

{
  void *in_RDI;
  
  ~cfdcapi_psbt_FundPsbt_Test((cfdcapi_psbt_FundPsbt_Test *)0x3a1ed8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(cfdcapi_psbt, FundPsbt) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  int net_type = kCfdNetworkTestnet;
  void* psbt_handle = nullptr;
  const char* exp_psbt_base64 = "cHNidP8BAP2GAQIAAAAH+DTafLXhg/yBX3hGInKEZg+koKWDviv7SlNb9CXlMd4BAAAAAP////9a72o7znYklRrluejAkI6P90ch7t96CZTVvx78fe6CgQIAAAAA/////6kt1klSeJ79FESTjpzlsQbnKACJxNxKeLPafHoradk/AwAAAAD//////Pcse7iIGUWVXkj1TmCBtRkBg2SE5cSKmSUGECnEBdEEAAAAAP////+gvhpNmiLIMtLSCjoITwENCamrQfs+Le29RusBBFePuQUAAAAA/////3GhQb9bZT4sQ3czBdaajJh2lERwyh4p5LA6CVPEvraVAQAAAAD/////PEJ8leyO15eW8T031SX76GhUXNkaHrDYn/kJgHMfOosHAAAAAP////8DgPD6AgAAAAAWABSzIr3c5jO4UaxzcKtFTws2egZU5YDw+gIAAAAAFgAUyrjFOm6PwCltHNORWjB9UcSRpVXykZgAAAAAABYAFCtuFro44oBQD4CyxXBu8C841ZCBAAAAAAABAR+AlpgAAAAAABYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAAAAEBH4CWmAAAAAAAFgAUi/CdYLfjTzSCfY28scdjkKkWyoIiBgInRM+yQ24VYEDsHI/oQtnvmhjLQK1B8xJyU5DDX3vTaxgqcEdgLAAAgAAAAIAAAACAAQAAAAIAAAAAAQEfgJaYAAAAAAAWABTx0+5ngpIl64ksyrAeIvand+fiHiIGAufo3CNvoCQ2lAjSzk2FCASCYavCl7gRYE2gh61x0ThVGCpwR2AsAACAAAAAgAAAAIABAAAAAwAAAAABAR+AlpgAAAAAABYAFBnWX4MosiBtmXB4VmDsDTSAj7B1IgYDPYdL8ZtpfPbGOWWVR6WDuGcwFkpbbbAb8goU65tq20QYKnBHYCwAAIAAAACAAAAAgAEAAAAEAAAAAAEBH4CWmAAAAAAAFgAUEreVSnXvwqIOhuMtwteGR9ZwB3kiBgL7Bhcw2948gGtKF6mfRUyBKCrs7m1G9Kl1qUzf06BlBBgqcEdgLAAAgAAAAIAAAACAAQAAAAUAAAAAAQEfgPD6AgAAAAAWABSXipBGDkRnGlL0mgm7WcxnlLY8iSIGA+PSRKOWfguHdl/ahsX/OIhfdJk5U7lYQ4iu8wsmr2rsGJ1rbYYsAACAAAAAgAAAAIABAAAAAQAAAAABAR+AlpgAAAAAABYAFBzoeOOg2js0MIeX/ey3YiH4VBivIgYDwCMlwyj+1iKp2I+PUxjgUmGjw6lntyEdfWdlfiten74YKnBHYCwAAIAAAACAAAAAgAEAAAAHAAAAACICA0c7/Ix3DBsiCi56rkut9sDX6vKQKNWynTQ4ASuyie+BGCpwR2AsAACAAAAAgAAAAIAAAAAAAgAAAAAiAgNkdK/yYzw1GGVTn7UrYrnW+55OI1dmKOHwoKeZNFjgbBida22GLAAAgAAAAIAAAACAAAAAAAIAAAAAIgIC9/DX0AKJt8Wlgbw1J2BAw0jeSPxBQGfzHqJq2VwAVQwYKnBHYCwAAIAAAACAAAAAgAEAAABkAAAAAA==";
  char* output = nullptr;
  ret = CfdCreatePsbtHandle(
    handle, net_type, "cHNidP8BAP0+AQIAAAAG+DTafLXhg/yBX3hGInKEZg+koKWDviv7SlNb9CXlMd4BAAAAAP////9a72o7znYklRrluejAkI6P90ch7t96CZTVvx78fe6CgQIAAAAA/////6kt1klSeJ79FESTjpzlsQbnKACJxNxKeLPafHoradk/AwAAAAD//////Pcse7iIGUWVXkj1TmCBtRkBg2SE5cSKmSUGECnEBdEEAAAAAP////+gvhpNmiLIMtLSCjoITwENCamrQfs+Le29RusBBFePuQUAAAAA/////3GhQb9bZT4sQ3czBdaajJh2lERwyh4p5LA6CVPEvraVAQAAAAD/////AoDw+gIAAAAAFgAUsyK93OYzuFGsc3CrRU8LNnoGVOWA8PoCAAAAABYAFMq4xTpuj8ApbRzTkVowfVHEkaVVAAAAAAABAR+AlpgAAAAAABYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAAAAEBH4CWmAAAAAAAFgAUi/CdYLfjTzSCfY28scdjkKkWyoIiBgInRM+yQ24VYEDsHI/oQtnvmhjLQK1B8xJyU5DDX3vTaxgqcEdgLAAAgAAAAIAAAACAAQAAAAIAAAAAAQEfgJaYAAAAAAAWABTx0+5ngpIl64ksyrAeIvand+fiHiIGAufo3CNvoCQ2lAjSzk2FCASCYavCl7gRYE2gh61x0ThVGCpwR2AsAACAAAAAgAAAAIABAAAAAwAAAAABAR+AlpgAAAAAABYAFBnWX4MosiBtmXB4VmDsDTSAj7B1IgYDPYdL8ZtpfPbGOWWVR6WDuGcwFkpbbbAb8goU65tq20QYKnBHYCwAAIAAAACAAAAAgAEAAAAEAAAAAAEBH4CWmAAAAAAAFgAUEreVSnXvwqIOhuMtwteGR9ZwB3kiBgL7Bhcw2948gGtKF6mfRUyBKCrs7m1G9Kl1qUzf06BlBBgqcEdgLAAAgAAAAIAAAACAAQAAAAUAAAAAAQEfgPD6AgAAAAAWABSXipBGDkRnGlL0mgm7WcxnlLY8iSIGA+PSRKOWfguHdl/ahsX/OIhfdJk5U7lYQ4iu8wsmr2rsGJ1rbYYsAACAAAAAgAAAAIABAAAAAQAAAAAiAgNHO/yMdwwbIgoueq5LrfbA1+rykCjVsp00OAErsonvgRgqcEdgLAAAgAAAAIAAAACAAAAAAAIAAAAAIgIDZHSv8mM8NRhlU5+1K2K51vueTiNXZijh8KCnmTRY4GwYnWtthiwAAIAAAACAAAAAgAAAAAACAAAAAA==", "", 0, 0, &psbt_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    void* fund_handle = nullptr;
    ret = CfdInitializeFundPsbt(handle, &fund_handle);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      uint32_t utxo_list_num = 5;
      CfdUtxo utxo_list[] = {
        {
           "8b3a1f738009f99fd8b01e1ad95c5468e8fb25d5373df19697d78eec957c423c", 7, 10000000,
           "wpkh([2a704760/44'/0'/0'/1/7]03c02325c328fed622a9d88f8f5318e05261a3c3a967b7211d7d67657e2b5e9fbe)",
           nullptr
        },
        {
           "0e5b0e16148da878ee8d9f0524ac0962a22dbbb66e2dc8a6237a1d4c8c4ea9cb", 8, 10000000,
           "wpkh([2a704760/44'/0'/0'/1/8]02f505e0b5885959bd2f7e68dd73915940a5540e05c41a42f6c598ceb21bdc55f3)",
           nullptr
        },
        {
           "016b36a0a9df54d55f7b907aba8fdd3d90d797eee2bc46c5ed7dced41218e674", 9, 10000000,
           "wpkh([2a704760/44'/0'/0'/1/9]02f7af7e1c3c8627e0e662ba04ec003879d9aeaeba5a02a1e24804ef4d7b497db4)",
           nullptr
        },
        {
           "dcc65ebfb8535f96f8a51e07d5c0a94f965000bd5765159a3cc27e4edd658c69", 10, 10000000,
           "wpkh([2a704760/44'/0'/0'/1/10]03c04e76f9bc7d6433a6eb7c0c3c446213c5f361dae22929483f23718e1cee4ece)",
           nullptr
        },
        {
           "0230e7471501f9432f727583f2bc17c11f5c1132140319ba2d7a5a0145684c73", 11, 10000000,
           "wpkh([2a704760/44'/0'/0'/1/11]03798ff13e5d17c6f8c1d69ff18d516613be2fa52149b3a8c60ef959d1075a5889)",
           nullptr
        }
      };
      for (uint32_t index=0; index<utxo_list_num; ++index) {
        ret = CfdFundPsbtAddToUtxoList(handle, fund_handle, utxo_list[index].txid,
            utxo_list[index].vout, utxo_list[index].amount, nullptr, utxo_list[index].descriptor,
            nullptr, nullptr);
        EXPECT_EQ(kCfdSuccess, ret);
      }

      ret = CfdSetOptionFundPsbt(handle, fund_handle, kCfdPsbtFundEstimateFeeRate,
          0, 2.0, false);
      EXPECT_EQ(kCfdSuccess, ret);
      ret = CfdSetOptionFundPsbt(handle, fund_handle, kCfdPsbtFundKnapsackMinChange,
          0, 0, false);
      EXPECT_EQ(kCfdSuccess, ret);

      uint32_t used_utxo_num = 0;
      int64_t fee = 0;
      ret = CfdFinalizeFundPsbt(handle, psbt_handle, fund_handle,
          "wpkh([2a704760/44'/0'/0'/1/100]02f7f0d7d00289b7c5a581bc35276040c348de48fc414067f31ea26ad95c00550c)",
          &fee, &used_utxo_num);
      EXPECT_EQ(kCfdSuccess, ret);
      EXPECT_EQ(1, used_utxo_num);
      EXPECT_EQ(1166, fee);

      uint32_t utxo_index = 0;
      char* txid = nullptr;
      char* descriptor = nullptr;
      uint32_t vout = 0;
      int64_t amount = 0;
      for (uint32_t index=0; index<used_utxo_num; ++index) {
        ret = CfdGetFundPsbtUsedUtxo(handle, fund_handle, index, &utxo_index,
            &txid, &vout, &amount, nullptr, &descriptor, nullptr);
        EXPECT_EQ(kCfdSuccess, ret);
        if (ret == kCfdSuccess) {
          EXPECT_STREQ(utxo_list[utxo_index].txid, txid);
          EXPECT_EQ(utxo_list[utxo_index].vout, vout);
          EXPECT_EQ(utxo_list[utxo_index].amount, amount);
          EXPECT_STREQ(utxo_list[utxo_index].descriptor, descriptor);

          ret = CfdFreeStringBuffer(txid);
          EXPECT_EQ(kCfdSuccess, ret);
          txid = nullptr;
          ret = CfdFreeStringBuffer(descriptor);
          EXPECT_EQ(kCfdSuccess, ret);
          descriptor = nullptr;
        }
      }

      ret = CfdFreeFundPsbt(handle, fund_handle);
      EXPECT_EQ(kCfdSuccess, ret);
    }

    ret = CfdGetPsbtData(handle, psbt_handle, &output, nullptr);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(exp_psbt_base64, output);
      CfdFreeStringBuffer(output);
      output = nullptr;
    }

    ret = CfdFreePsbtHandle(handle, psbt_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}